

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O1

void PacketIO::GetInterface(char *name)

{
  char *__s1;
  long *plVar1;
  int iVar2;
  long *in_RAX;
  ifaddrs *ifaddr;
  long *local_28;
  
  local_28 = in_RAX;
  iVar2 = getifaddrs(&local_28);
  plVar1 = local_28;
  if (iVar2 == 0) {
    for (; plVar1 != (long *)0x0; plVar1 = (long *)*plVar1) {
      if (((short *)plVar1[3] != (short *)0x0) && (*(short *)plVar1[3] == 0x11)) {
        __s1 = (char *)plVar1[1];
        iVar2 = strcmp(__s1,"lo");
        if (iVar2 != 0) {
          strcpy(name,__s1);
          break;
        }
      }
    }
    freeifaddrs(local_28);
  }
  return;
}

Assistant:

void PacketIO::GetInterface(char* name)
{
    struct ifaddrs* ifaddr;

    if (getifaddrs(&ifaddr) == 0)
    {
        for (struct ifaddrs* ifa = ifaddr; ifa != nullptr; ifa = ifa->ifa_next)
        {
            if (ifa->ifa_addr == nullptr)
            {
                continue;
            }
            int family = ifa->ifa_addr->sa_family;

            if (family == AF_PACKET)
            {
                if (strcmp(ifa->ifa_name, "lo") != 0)
                {
                    // yes, this is unsafe
                    strcpy(name, ifa->ifa_name);
                    break;
                }
            }

            // /* Display interface name and family (including symbolic
            //     form of the latter for the common families) */

            // printf("%-8s %s (%d)\n",
            //         ifa->ifa_name,
            //         (family == AF_PACKET) ? "AF_PACKET" :
            //         (family == AF_INET) ? "AF_INET" :
            //         (family == AF_INET6) ? "AF_INET6" : "???",
            //         family);
        }
        freeifaddrs(ifaddr);
    }
}